

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_joinref.cpp
# Opt level: O2

void duckdb::AddUsingBindings
               (UsingColumnSet *set,optional_ptr<duckdb::UsingColumnSet,_true> input_set,
               BindingAlias *input_binding)

{
  pointer pBVar1;
  UsingColumnSet *pUVar2;
  BindingAlias *entry;
  pointer __x;
  optional_ptr<duckdb::UsingColumnSet,_true> local_20;
  
  local_20.ptr = input_set.ptr;
  if (input_set.ptr != (UsingColumnSet *)0x0) {
    pUVar2 = optional_ptr<duckdb::UsingColumnSet,_true>::operator->(&local_20);
    pBVar1 = (pUVar2->bindings).
             super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
             super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl
             .super__Vector_impl_data._M_finish;
    for (__x = (pUVar2->bindings).
               super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
               super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
               _M_impl.super__Vector_impl_data._M_start; __x != pBVar1; __x = __x + 1) {
      ::std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>::push_back
                (&(set->bindings).
                  super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>,__x);
    }
    return;
  }
  ::std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>::push_back
            (&(set->bindings).
              super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>,
             input_binding);
  return;
}

Assistant:

static void AddUsingBindings(UsingColumnSet &set, optional_ptr<UsingColumnSet> input_set,
                             const BindingAlias &input_binding) {
	if (input_set) {
		for (auto &entry : input_set->bindings) {
			set.bindings.push_back(entry);
		}
	} else {
		set.bindings.push_back(input_binding);
	}
}